

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O2

int mbedtls_ssl_handshake_server_step(mbedtls_ssl_context *ssl)

{
  uchar *buf;
  byte *buf_00;
  uint uVar1;
  mbedtls_ssl_cookie_write_t *pmVar2;
  _func_int_void_ptr_mbedtls_ssl_session_ptr *p_Var3;
  mbedtls_ssl_cookie_check_t *pmVar4;
  int *piVar5;
  char cVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  mbedtls_ssl_key_cert *pmVar11;
  byte bVar12;
  uchar uVar13;
  ushort uVar14;
  ushort uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  mbedtls_key_exchange_type_t mVar19;
  mbedtls_md_type_t mVar20;
  mbedtls_pk_type_t mVar21;
  mbedtls_md_type_t mVar22;
  mbedtls_ecp_curve_info **crv;
  mbedtls_pk_context *pmVar23;
  time_t tVar24;
  mbedtls_ecp_group_id *pmVar25;
  ulong uVar26;
  mbedtls_ssl_session *pmVar27;
  mbedtls_ssl_ciphersuite_t *pmVar28;
  mbedtls_cipher_info_t *pmVar29;
  mbedtls_ssl_handshake_params *pmVar30;
  size_t sVar31;
  size_t sVar32;
  mbedtls_md_info_t *pmVar33;
  mbedtls_ecp_curve_info **ppmVar34;
  mbedtls_ecp_curve_info *pmVar35;
  int line;
  ulong uVar36;
  mbedtls_ssl_config *pmVar37;
  ulong uVar38;
  mbedtls_x509_crt *pmVar39;
  uchar *puVar40;
  ulong uVar41;
  ushort *puVar42;
  mbedtls_ssl_key_cert *pmVar43;
  char *pcVar44;
  uint cli_msg_seq;
  mbedtls_mpi *X;
  int *piVar45;
  uchar *puVar46;
  ushort *puVar47;
  byte *pbVar48;
  long lVar49;
  uint32_t auVar50 [2];
  long lVar51;
  long lVar52;
  size_t hash_len;
  ulong uVar53;
  uchar *puVar54;
  mbedtls_sha1_context *hash_00;
  mbedtls_md_type_t *pmVar55;
  bool bVar56;
  size_t sStackY_210;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined8 in_stack_fffffffffffffe00;
  uchar *local_1f0;
  ushort *local_1e8;
  mbedtls_ssl_key_cert *local_1e0;
  size_t local_1c0;
  size_t signature_len;
  char *local_1a8;
  ushort *local_1a0;
  size_t len;
  char **local_190;
  ushort *local_188;
  char *local_180;
  byte *local_178;
  ulong local_170;
  mbedtls_sha1_context mbedtls_sha1;
  undefined1 auStack_d0 [8];
  uchar hash [64];
  mbedtls_md5_context mbedtls_md5;
  
  uVar57 = (undefined4)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  iVar17 = -0x7100;
  if (ssl->state == 0x10) {
    return -0x7100;
  }
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    return -0x7100;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,0xede,"server state: %d");
  iVar16 = mbedtls_ssl_flush_output(ssl);
  if (iVar16 != 0) {
    return iVar16;
  }
  if ((((ssl->conf->field_0x174 & 2) != 0) && (ssl->handshake->retransmit_state == '\x01')) &&
     (iVar16 = mbedtls_ssl_resend(ssl), iVar16 != 0)) {
    return iVar16;
  }
  switch(ssl->state) {
  case 0:
    ssl->state = 1;
    return 0;
  case 1:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x440,"=> parse client hello");
    while( true ) {
      if ((ssl->renego_status == 0) && (iVar17 = mbedtls_ssl_fetch_input(ssl,5), iVar17 != 0)) {
        pcVar44 = "mbedtls_ssl_fetch_input";
        iVar16 = 0x450;
        goto LAB_00114f55;
      }
      pbVar48 = ssl->in_hdr;
      sVar32 = (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5;
      mbedtls_debug_print_buf
                (ssl,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x45f,"record header",pbVar48,sVar32);
      uVar57 = (undefined4)(sVar32 >> 0x20);
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x46b,"client hello v3, message type: %d",(ulong)*pbVar48);
      if (*pbVar48 != 0x16) {
        iVar17 = 0x46f;
        goto LAB_00115bd9;
      }
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x474,"client hello v3, message len.: %d",
                 (ulong)(ushort)(*(ushort *)ssl->in_len << 8 | *(ushort *)ssl->in_len >> 8));
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x477,"client hello v3, protocol version: [%d:%d]",(ulong)pbVar48[1],
                 CONCAT44(uVar57,(uint)pbVar48[2]));
      mbedtls_ssl_read_version
                ((int *)&mbedtls_md5,(int *)hash,*(uint *)&ssl->conf->field_0x174 >> 1 & 1,
                 pbVar48 + 1);
      uVar57 = (undefined4)((ulong)in_stack_fffffffffffffe00 >> 0x20);
      if ((int)mbedtls_md5.total[0] < 3) {
        iVar17 = 0x481;
        goto LAB_00115bd9;
      }
      if (((ssl->conf->field_0x174 & 2) == 0) || (ssl->renego_status != 0)) goto LAB_0011562f;
      puVar54 = ssl->in_ctr;
      if ((*puVar54 != '\0') || (puVar54[1] != '\0')) {
        iVar17 = 0x491;
        goto LAB_00115bd9;
      }
      puVar46 = ssl->out_ctr;
      *(undefined2 *)(puVar46 + 6) = *(undefined2 *)(puVar54 + 6);
      *(undefined4 *)(puVar46 + 2) = *(undefined4 *)(puVar54 + 2);
      iVar17 = mbedtls_ssl_dtls_replay_check(ssl);
      uVar57 = (undefined4)((ulong)in_stack_fffffffffffffe00 >> 0x20);
      if (iVar17 == 0) break;
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x49a,"replayed record, discarding");
      ssl->next_record_offset = 0;
      ssl->in_left = 0;
    }
    mbedtls_ssl_dtls_replay_update(ssl);
LAB_0011562f:
    if (ssl->renego_status == 0) {
      uVar14 = *(ushort *)ssl->in_len << 8 | *(ushort *)ssl->in_len >> 8;
      sVar32 = (size_t)uVar14;
      if (0x4000 < uVar14) {
        iVar17 = 0x4b3;
        goto LAB_00115bd9;
      }
      iVar17 = mbedtls_ssl_fetch_input
                         (ssl,sVar32 + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5);
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_ssl_fetch_input";
        iVar16 = 0x4b9;
        goto LAB_00114f55;
      }
      if ((ssl->conf->field_0x174 & 2) == 0) {
        ssl->in_left = 0;
      }
      else {
        ssl->next_record_offset = sVar32 + 0xd;
      }
    }
    else {
      sVar32 = ssl->in_hslen;
    }
    pbVar48 = ssl->in_msg;
    uVar26 = sVar32;
    mbedtls_debug_print_buf
              (ssl,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x4c8,"record contents",pbVar48,sVar32);
    uVar58 = (undefined4)(uVar26 >> 0x20);
    (*ssl->handshake->update_checksum)(ssl,pbVar48,sVar32);
    if (sVar32 < (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 4) {
      iVar17 = 0x4d6;
      goto LAB_00115bd9;
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x4da,"client hello v3, handshake type: %d",(ulong)*pbVar48);
    if (*pbVar48 != 1) {
      iVar17 = 0x4de;
      goto LAB_00115bd9;
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x4e3,"client hello v3, handshake len.: %d",
               (ulong)((uint)pbVar48[3] | (uint)pbVar48[2] << 8 | (uint)pbVar48[1] << 0x10));
    if (pbVar48[1] == 0) {
      pmVar37 = ssl->conf;
      uVar18 = *(uint *)&pmVar37->field_0x174;
      if (sVar32 == (ulong)(ushort)(*(ushort *)(pbVar48 + 2) << 8 | *(ushort *)(pbVar48 + 2) >> 8) +
                    (ulong)(uVar18 & 2) * 4 + 4) {
        if ((uVar18 & 2) == 0) {
          lVar49 = 4;
        }
        else {
          puVar54 = ssl->in_msg;
          uVar14 = *(ushort *)(puVar54 + 4) << 8 | *(ushort *)(puVar54 + 4) >> 8;
          pmVar30 = ssl->handshake;
          uVar18 = (uint)uVar14;
          if (ssl->renego_status == 1) {
            if (uVar18 != pmVar30->in_msg_seq) {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                         ,0x4ff,"bad client hello message_seq: %d (expected %d)",(ulong)uVar14,
                         CONCAT44(uVar58,pmVar30->in_msg_seq));
              return -0x7900;
            }
          }
          else {
            pmVar30->out_msg_seq = uVar18;
          }
          pmVar30->in_msg_seq = uVar18 + 1;
          if ((((puVar54[6] != '\0') || (puVar54[7] != '\0')) || (puVar54[8] != '\0')) ||
             (iVar17 = bcmp(puVar54 + 1,puVar54 + 9,3), iVar17 != 0)) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0x515,"ClientHello fragmentation not supported");
            return -0x7080;
          }
          lVar49 = (ulong)((pmVar37->field_0x174 & 2) >> 1) * 8 + 4;
        }
        uVar26 = sVar32 - lVar49;
        if (uVar26 < 0x26) {
          iVar17 = 0x535;
          goto LAB_00115bd9;
        }
        buf_00 = pbVar48 + lVar49;
        uVar58 = 0;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0x53c,"client hello, version",buf_00,2);
        piVar45 = &ssl->minor_ver;
        mbedtls_ssl_read_version
                  (&ssl->major_ver,piVar45,*(uint *)&ssl->conf->field_0x174 >> 1 & 1,buf_00);
        uVar18 = ssl->major_ver;
        pmVar30 = ssl->handshake;
        pmVar30->max_major_ver = uVar18;
        uVar1 = ssl->minor_ver;
        pmVar30->max_minor_ver = uVar1;
        pmVar37 = ssl->conf;
        if ((int)uVar1 < (int)(uint)pmVar37->min_minor_ver ||
            (int)uVar18 < (int)(uint)pmVar37->min_major_ver) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0x54a,"client only supports ssl smaller than minimum [%d:%d] < [%d:%d]",
                     (ulong)uVar18,CONCAT44(uVar58,uVar1),
                     CONCAT44(uVar57,(uint)pmVar37->min_major_ver),(uint)pmVar37->min_minor_ver);
          mbedtls_ssl_send_alert_message(ssl,'\x02','F');
          return -0x6e80;
        }
        if (pmVar37->max_major_ver < uVar18) {
          ssl->major_ver = (uint)pmVar37->max_major_ver;
          bVar12 = pmVar37->max_minor_ver;
LAB_00116e35:
          *piVar45 = (uint)bVar12;
        }
        else {
          bVar12 = pmVar37->max_minor_ver;
          if (bVar12 < uVar1) goto LAB_00116e35;
        }
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0x55d,"client hello, random bytes",buf_00 + 2,0x20);
        pmVar30 = ssl->handshake;
        uVar7 = *(undefined8 *)(buf_00 + 2);
        uVar8 = *(undefined8 *)(buf_00 + 10);
        uVar9 = *(undefined8 *)(buf_00 + 0x1a);
        *(undefined8 *)(pmVar30->randbytes + 0x10) = *(undefined8 *)(buf_00 + 0x12);
        *(undefined8 *)(pmVar30->randbytes + 0x18) = uVar9;
        *(undefined8 *)pmVar30->randbytes = uVar7;
        *(undefined8 *)(pmVar30->randbytes + 8) = uVar8;
        uVar36 = (ulong)buf_00[0x22];
        if ((0x20 < uVar36) || (uVar38 = uVar36 + 0x24, uVar26 < uVar38)) {
          iVar17 = 0x569;
          goto LAB_00115bd9;
        }
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0x56d,"client hello, session id",buf_00 + 0x23,uVar36);
        pmVar27 = ssl->session_negotiate;
        pmVar27->id_len = uVar36;
        pmVar27->id[0] = '\0';
        pmVar27->id[1] = '\0';
        pmVar27->id[2] = '\0';
        pmVar27->id[3] = '\0';
        pmVar27->id[4] = '\0';
        pmVar27->id[5] = '\0';
        pmVar27->id[6] = '\0';
        pmVar27->id[7] = '\0';
        pmVar27->id[8] = '\0';
        pmVar27->id[9] = '\0';
        pmVar27->id[10] = '\0';
        pmVar27->id[0xb] = '\0';
        pmVar27->id[0xc] = '\0';
        pmVar27->id[0xd] = '\0';
        pmVar27->id[0xe] = '\0';
        pmVar27->id[0xf] = '\0';
        pmVar27->id[0x10] = '\0';
        pmVar27->id[0x11] = '\0';
        pmVar27->id[0x12] = '\0';
        pmVar27->id[0x13] = '\0';
        pmVar27->id[0x14] = '\0';
        pmVar27->id[0x15] = '\0';
        pmVar27->id[0x16] = '\0';
        pmVar27->id[0x17] = '\0';
        pmVar27->id[0x18] = '\0';
        pmVar27->id[0x19] = '\0';
        pmVar27->id[0x1a] = '\0';
        pmVar27->id[0x1b] = '\0';
        pmVar27->id[0x1c] = '\0';
        pmVar27->id[0x1d] = '\0';
        pmVar27->id[0x1e] = '\0';
        pmVar27->id[0x1f] = '\0';
        memcpy(ssl->session_negotiate->id,buf_00 + 0x23,ssl->session_negotiate->id_len);
        if ((ssl->conf->field_0x174 & 2) == 0) {
          local_1e0 = (mbedtls_ssl_key_cert *)(uVar36 + 0x23);
        }
        else {
          uVar41 = (ulong)buf_00[uVar36 + 0x23];
          if (uVar26 < uVar38 + uVar41 + 2) {
            iVar17 = 0x580;
            goto LAB_00115bd9;
          }
          local_1e0 = (mbedtls_ssl_key_cert *)(uVar38 + uVar41);
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0x585,"client hello, cookie",buf_00 + uVar36 + 0x24,uVar41);
          pmVar4 = ssl->conf->f_cookie_check;
          if ((pmVar4 == (mbedtls_ssl_cookie_check_t *)0x0) || (ssl->renego_status != 0)) {
            if (uVar41 != 0) {
              iVar17 = 0x5a1;
              goto LAB_00115bd9;
            }
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0x5a5,"cookie verification skipped");
          }
          else {
            iVar17 = (*pmVar4)(ssl->conf->p_cookie,buf_00 + uVar36 + 0x24,uVar41,ssl->cli_id,
                               ssl->cli_id_len);
            if (iVar17 == 0) {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                         ,0x597,"cookie verification passed");
              ssl->handshake->verify_cookie_len = '\0';
            }
            else {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                         ,0x592,"cookie verification failed");
              ssl->handshake->verify_cookie_len = '\x01';
            }
          }
        }
        uVar38 = (ulong)CONCAT11(buf_00[(long)local_1e0],buf_00[(long)local_1e0 + 1]);
        if ((1 < uVar38) && ((buf_00[(long)local_1e0 + 1] & 1) == 0)) {
          uVar41 = (long)local_1e0 + uVar38 + 2;
          if (uVar41 < uVar26) {
            local_178 = buf_00 + (long)local_1e0 + 2;
            mbedtls_debug_print_buf
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0x5bd,"client hello, ciphersuitelist",local_178,uVar38);
            bVar12 = buf_00[uVar41];
            if ((0xf < (byte)(bVar12 - 1)) || (uVar41 = bVar12 + uVar41, uVar26 <= uVar41)) {
              iVar17 = 0x5ca;
              goto LAB_00115bd9;
            }
            mbedtls_debug_print_buf
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0x5cf,"client hello, compression",buf_00 + (long)local_1e0 + uVar38 + 3,
                       (ulong)bVar12);
            ssl->session_negotiate->compression = 0;
            if (uVar41 + 1 < uVar26) {
              if (uVar26 < uVar41 + 3) {
                iVar17 = 0x5f0;
                goto LAB_00115bd9;
              }
              local_1c0 = (size_t)(ushort)(*(ushort *)(buf_00 + uVar41 + 1) << 8 |
                                          *(ushort *)(buf_00 + uVar41 + 1) >> 8);
              if ((0xfffffffffffffffc < local_1c0 - 4) || (uVar26 != uVar41 + 3 + local_1c0)) {
                iVar17 = 0x5fa;
                goto LAB_00115bd9;
              }
            }
            else {
              local_1c0 = 0;
            }
            local_1e8 = (ushort *)(buf_00 + uVar41 + 3);
            mbedtls_debug_print_buf
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0x602,"client hello extensions",(uchar *)local_1e8,local_1c0);
            local_180 = ssl->peer_verify_data;
            bVar10 = false;
            do {
              if (local_1c0 == 0) {
                uVar26 = 0;
                goto LAB_00117c80;
              }
              uVar14 = local_1e8[1] << 8 | local_1e8[1] >> 8;
              uVar26 = (ulong)uVar14;
              local_170 = (ulong)(uVar14 + 4);
              bVar56 = local_1c0 < local_170;
              local_1c0 = local_1c0 - local_170;
              if (bVar56) {
                iVar17 = 0x60d;
                goto LAB_00115bd9;
              }
              uVar15 = *local_1e8 << 8 | *local_1e8 >> 8;
              uVar41 = (ulong)uVar15;
              if (uVar15 < 0x11) {
                uVar18 = (uint)uVar14;
                switch(uVar15) {
                case 0:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                             ,0x614,"found ServerName extension");
                  if (ssl->conf->f_sni !=
                      (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) {
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                               ,0x62,"parse ServerName extension");
                    uVar14 = local_1e8[2] << 8 | local_1e8[2] >> 8;
                    uVar26 = (ulong)uVar14;
                    if (uVar14 + 2 != uVar18) {
                      iVar17 = 0x67;
                      goto LAB_00115bd9;
                    }
                    puVar47 = local_1e8 + 3;
                    while (uVar26 != 0) {
                      uVar53 = (ulong)(ushort)(*(ushort *)((long)puVar47 + 1) << 8 |
                                              *(ushort *)((long)puVar47 + 1) >> 8);
                      uVar41 = uVar53 + 3;
                      bVar56 = uVar26 < uVar41;
                      uVar26 = uVar26 - uVar41;
                      if (bVar56) {
                        iVar17 = 0x71;
                        goto LAB_00115bd9;
                      }
                      if ((byte)*puVar47 == 0) {
                        iVar17 = (*ssl->conf->f_sni)(ssl->conf->p_sni,ssl,
                                                     (byte *)((long)puVar47 + 3),uVar53);
                        if (iVar17 != 0) {
                          mbedtls_debug_print_ret
                                    (ssl,1,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                                     ,0x7b,"ssl_sni_wrapper",iVar17);
                          uVar13 = 'p';
                          goto LAB_00117d4a;
                        }
                        break;
                      }
                      puVar47 = (ushort *)((long)puVar47 + uVar41);
                    }
                  }
                  break;
                case 1:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                             ,0x65a,"found max fragment length extension");
                  if ((uVar18 != 1) || (4 < (byte)local_1e8[2])) {
                    iVar17 = 0x16a;
                    goto LAB_00115bd9;
                  }
                  ssl->session_negotiate->mfl_code = (byte)local_1e8[2];
                  break;
                default:
switchD_001173a1_caseD_2:
                  iVar17 = 3;
                  iVar16 = 0x696;
                  pcVar44 = "unknown extension found: %d (ignoring)";
                  goto LAB_00117a22;
                case 4:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                             ,0x664,"found truncated hmac extension");
                  if (uVar14 != 0) {
                    iVar17 = 0x17b;
                    goto LAB_00115bd9;
                  }
                  if ((ssl->conf->field_0x175 & 0x80) != 0) {
                    ssl->session_negotiate->trunc_hmac = 1;
                  }
                  break;
                case 10:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                             ,0x63c,"found supported elliptic curves extension");
                  bVar12 = *(byte *)((long)local_1e8 + 5);
                  if (((bVar12 & 1) != 0) ||
                     (uVar26 = (ulong)(byte)local_1e8[2] * 0x100,
                     (int)uVar26 + (uint)bVar12 + 2 != (uint)uVar14)) {
                    iVar17 = 0xf9;
                    goto LAB_00115bd9;
                  }
                  pmVar30 = ssl->handshake;
                  if (pmVar30->curves != (mbedtls_ecp_curve_info **)0x0) {
                    iVar17 = 0x100;
                    goto LAB_00115bd9;
                  }
                  uVar26 = uVar26 | bVar12;
                  uVar41 = uVar26 >> 1;
                  if (10 < uVar41) {
                    uVar41 = 0xb;
                  }
                  uVar41 = uVar41 + 1;
                  ppmVar34 = (mbedtls_ecp_curve_info **)calloc(uVar41,8);
                  if (ppmVar34 == (mbedtls_ecp_curve_info **)0x0) {
                    return -0x7f00;
                  }
                  pmVar30->curves = ppmVar34;
                  uVar53 = 0;
                  while ((uVar26 != uVar53 && (1 < uVar41))) {
                    uVar14 = *(ushort *)((long)local_1e8 + uVar53 + 6);
                    pmVar35 = mbedtls_ecp_curve_info_from_tls_id(uVar14 << 8 | uVar14 >> 8);
                    if (pmVar35 != (mbedtls_ecp_curve_info *)0x0) {
                      *ppmVar34 = pmVar35;
                      ppmVar34 = ppmVar34 + 1;
                      uVar41 = uVar41 - 1;
                    }
                    uVar53 = uVar53 + 2;
                  }
                  break;
                case 0xb:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                             ,0x644,"found supported point formats extension");
                  pmVar30 = ssl->handshake;
                  piVar5 = &pmVar30->cli_exts;
                  *piVar5 = *piVar5 | 1;
                  if ((byte)local_1e8[2] + 1 != uVar18) {
                    iVar17 = 299;
                    goto LAB_00115bd9;
                  }
                  uVar26 = 0;
                  do {
                    uVar41 = uVar26;
                    if ((byte)local_1e8[2] == uVar41) goto LAB_00117a29;
                    uVar18 = (uint)*(byte *)((long)local_1e8 + uVar41 + 5);
                    uVar26 = uVar41 + 1;
                  } while (1 < uVar18);
                  (pmVar30->ecdh_ctx).point_format = uVar18;
                  uVar41 = (ulong)*(byte *)((long)local_1e8 + uVar41 + 5);
                  iVar17 = 4;
                  iVar16 = 0x13b;
                  pcVar44 = "point format selected: %d";
LAB_00117a22:
                  mbedtls_debug_print_msg
                            (ssl,iVar17,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                             ,iVar16,pcVar44,uVar41);
                  break;
                case 0xd:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                             ,0x62c,"found signature_algorithms extension");
                  if (ssl->renego_status != 1) {
                    if (((*(byte *)((long)local_1e8 + 5) & 1) == 0) &&
                       ((uint)*(byte *)((long)local_1e8 + 5) + (uint)(byte)local_1e8[2] * 0x100 + 2
                        == (uint)uVar14)) {
                      local_1a0 = local_1e8 + 3;
                      for (pmVar55 = (mbedtls_md_type_t *)ssl->conf->sig_hashes; puVar47 = local_1a0
                          , *pmVar55 != MBEDTLS_MD_NONE; pmVar55 = pmVar55 + 1) {
                        while (puVar42 = puVar47, puVar42 < (ushort *)((long)local_1e8 + uVar26 + 4)
                              ) {
                          mVar20 = *pmVar55;
                          mVar22 = mbedtls_ssl_md_alg_from_hash((byte)*puVar42);
                          puVar47 = puVar42 + 1;
                          if (mVar20 == mVar22) {
                            uVar41 = (ulong)(byte)*puVar42;
                            ssl->handshake->sig_alg = (uint)(byte)*puVar42;
                            iVar17 = 3;
                            iVar16 = 0xe4;
                            pcVar44 = "client hello v3, signature_algorithm ext: %d";
                            goto LAB_00117a22;
                          }
                        }
                      }
                      iVar17 = 0xdf;
                      pcVar44 = "no signature_algorithm in common";
                      goto LAB_001179f4;
                    }
                    iVar17 = 0xcb;
                    goto LAB_00115bd9;
                  }
                  break;
                case 0x10:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                             ,0x68c,"found alpn extension");
                  local_190 = ssl->conf->alpn_list;
                  if (local_190 != (char **)0x0) {
                    if (uVar18 < 4) {
                      return -0x7900;
                    }
                    if ((ulong)(ushort)(local_1e8[2] << 8 | local_1e8[2] >> 8) != uVar26 - 2) {
                      return -0x7900;
                    }
                    local_188 = local_1e8 + 3;
                    local_1a0 = (ushort *)((long)local_1e8 + uVar26 + 4);
                    do {
                      local_1a8 = *local_190;
                      if (local_1a8 == (char *)0x0) {
                        mbedtls_ssl_send_alert_message(ssl,'\x02','x');
                        return -0x7900;
                      }
                      sVar31 = strlen(local_1a8);
                      for (puVar47 = local_188; puVar47 != local_1a0;
                          puVar47 = (ushort *)((byte *)((long)puVar47 + 1) + uVar26)) {
                        if (local_1a0 < puVar47) {
                          return -0x7900;
                        }
                        uVar26 = (ulong)(byte)*puVar47;
                        if (uVar26 == 0) {
                          return -0x7900;
                        }
                        if ((sVar31 == uVar26) &&
                           (iVar17 = bcmp((byte *)((long)puVar47 + 1),local_1a8,sVar31), iVar17 == 0
                           )) {
                          ssl->alpn_chosen = local_1a8;
                          goto LAB_00117a29;
                        }
                      }
                      local_190 = local_190 + 1;
                    } while( true );
                  }
                }
              }
              else if (uVar15 == 0x16) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                           ,0x66e,"found encrypt then mac extension");
                if (uVar14 != 0) {
                  iVar17 = 399;
                  goto LAB_00115bd9;
                }
                if (((ssl->conf->field_0x175 & 4) != 0) && (*piVar45 != 0)) {
                  ssl->session_negotiate->encrypt_then_mac = 1;
                }
              }
              else if (uVar15 == 0x17) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                           ,0x678,"found extended master secret extension");
                if (uVar14 != 0) {
                  iVar17 = 0x1a6;
                  goto LAB_00115bd9;
                }
                if (((ssl->conf->field_0x175 & 8) != 0) && (*piVar45 != 0)) {
                  ssl->handshake->extended_ms = 1;
                }
              }
              else {
                if (uVar15 == 0x23) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                             ,0x682,"found session ticket extension");
                  mbedtls_ssl_session_init((mbedtls_ssl_session *)&mbedtls_sha1);
                  if ((ssl->conf->f_ticket_parse != (mbedtls_ssl_ticket_parse_t *)0x0) &&
                     (ssl->conf->f_ticket_write != (mbedtls_ssl_ticket_write_t *)0x0)) {
                    ssl->handshake->new_session_ticket = 1;
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                               ,0x1c9,"ticket length: %d",uVar26);
                    if (uVar14 != 0) {
                      if (ssl->renego_status == 0) {
                        iVar17 = (*ssl->conf->f_ticket_parse)
                                           (ssl->conf->p_ticket,(mbedtls_ssl_session *)&mbedtls_sha1
                                            ,(uchar *)(local_1e8 + 2),uVar26);
                        if (iVar17 == 0) {
                          pmVar27 = ssl->session_negotiate;
                          mbedtls_sha1.state._8_8_ = pmVar27->id_len;
                          memcpy(mbedtls_sha1.state + 4,pmVar27->id,mbedtls_sha1.state._8_8_);
                          mbedtls_ssl_session_free(pmVar27);
                          memcpy(ssl->session_negotiate,&mbedtls_sha1,0x98);
                          for (lVar52 = -0x98; lVar52 != 0; lVar52 = lVar52 + 1) {
                            auStack_d0[lVar52] = 0;
                          }
                          mbedtls_debug_print_msg
                                    (ssl,3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                                     ,0x1f5,"session successfully restored from ticket");
                          pmVar30 = ssl->handshake;
                          pmVar30->resume = 1;
                          pmVar30->new_session_ticket = 0;
                          goto LAB_00117a29;
                        }
                        mbedtls_ssl_session_free((mbedtls_ssl_session *)&mbedtls_sha1);
                        if (iVar17 == -0x6d80) {
                          iVar17 = 0x1e1;
                          pcVar44 = "ticket is expired";
                        }
                        else {
                          if (iVar17 != -0x7180) {
                            mbedtls_debug_print_ret
                                      (ssl,1,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                                       ,0x1e3,"mbedtls_ssl_ticket_parse",iVar17);
                            goto LAB_00117a29;
                          }
                          iVar17 = 0x1df;
                          pcVar44 = "ticket is not authentic";
                        }
                      }
                      else {
                        iVar17 = 0x1d1;
                        pcVar44 = "ticket rejected: renegotiating";
                      }
LAB_001179f4:
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                                 ,iVar17,pcVar44);
                    }
                  }
                  goto LAB_00117a29;
                }
                if (uVar15 != 0xff01) goto switchD_001173a1_caseD_2;
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                           ,0x61f,"found renegotiation extension");
                if (ssl->renego_status != 0) {
                  sVar32 = ssl->verify_data_len;
                  if ((sVar32 + 1 == uVar26) && (sVar32 == (byte)local_1e8[2])) {
                    iVar17 = mbedtls_ssl_safer_memcmp
                                       ((byte *)((long)local_1e8 + 5),local_180,sVar32);
                    bVar10 = true;
                    if (iVar17 == 0) goto LAB_00117a29;
                  }
                  pcVar44 = "non-matching renegotiation info";
                  iVar17 = 0xa0;
                  goto LAB_001184d4;
                }
                if ((uVar14 != 1) || ((byte)local_1e8[2] != 0)) {
                  pcVar44 = "non-zero length renegotiation info";
                  iVar17 = 0xad;
                  goto LAB_001184d4;
                }
                ssl->secure_renegotiation = 1;
                bVar10 = true;
              }
LAB_00117a29:
              local_1e8 = (ushort *)((long)local_1e8 + local_170);
            } while (2 < local_1c0 - 1);
            iVar17 = 0x69e;
            goto LAB_00115bd9;
          }
        }
        iVar17 = 0x5b8;
        goto LAB_00115bd9;
      }
    }
    iVar17 = 0x4e9;
LAB_00115bd9:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,iVar17,"bad client hello message");
    return -0x7900;
  case 2:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x8b1,"=> write server hello");
    uVar18 = *(uint *)&ssl->conf->field_0x174;
    if (((uVar18 & 2) != 0) && (ssl->handshake->verify_cookie_len != '\0')) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x8b7,"client hello was not authenticated");
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x8b8,"<= write server hello");
      puVar54 = ssl->out_msg;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x870,"=> write hello verify request");
      mbedtls_ssl_write_version
                (ssl->major_ver,ssl->minor_ver,*(uint *)&ssl->conf->field_0x174 >> 1 & 1,puVar54 + 4
                );
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x87d,"server version",puVar54 + 4,2);
      pmVar2 = ssl->conf->f_cookie_write;
      if (pmVar2 != (mbedtls_ssl_cookie_write_t *)0x0) {
        auVar50 = (uint32_t  [2])((long)puVar54 + 7);
        mbedtls_sha1.total = auVar50;
        iVar17 = (*pmVar2)(ssl->conf->p_cookie,(uchar **)&mbedtls_sha1,ssl->out_buf + 0x414d,
                           ssl->cli_id,ssl->cli_id_len);
        if (iVar17 == 0) {
          bVar12 = (char)mbedtls_sha1.total[0] - (char)auVar50[0];
          puVar54[6] = bVar12;
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0x894,"cookie sent",(uchar *)auVar50,(ulong)bVar12);
          ssl->out_msglen = (long)mbedtls_sha1.total - (long)ssl->out_msg;
          ssl->out_msgtype = 0x16;
          *ssl->out_msg = '\x03';
          ssl->state = 0x12;
          iVar17 = mbedtls_ssl_write_record(ssl);
          if (iVar17 == 0) {
            pcVar44 = "<= write hello verify request";
            iVar17 = 0;
            iVar16 = 2;
            line = 0x8a2;
            goto LAB_00115417;
          }
          pcVar44 = "mbedtls_ssl_write_record";
          iVar16 = 0x89e;
        }
        else {
          pcVar44 = "f_cookie_write";
          iVar16 = 0x88e;
        }
        goto LAB_00114f55;
      }
      pcVar44 = "inconsistent cookie callbacks";
      iVar17 = 0x883;
LAB_001157f3:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,iVar17,pcVar44);
      return -0x6c00;
    }
    if (ssl->conf->f_rng == (mbedtls_ssl_recv_t *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x8c0,"no RNG provided");
      return -0x7400;
    }
    puVar54 = ssl->out_msg;
    mbedtls_ssl_write_version(ssl->major_ver,ssl->minor_ver,uVar18 >> 1 & 1,puVar54 + 4);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x8d3,"server hello, chosen version: [%d:%d]",(ulong)puVar54[4],
               CONCAT44(uVar57,(uint)puVar54[5]));
    tVar24 = time((time_t *)0x0);
    uVar18 = (uint)tVar24;
    *(uint *)(puVar54 + 6) =
         uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x8dc,"server hello, current time: %lu",tVar24);
    iVar17 = (*ssl->conf->f_rng)(ssl->conf->p_rng,puVar54 + 10,0x1c);
    if (iVar17 != 0) {
      return iVar17;
    }
    pmVar30 = ssl->handshake;
    uVar7 = *(undefined8 *)(puVar54 + 6);
    uVar8 = *(undefined8 *)(puVar54 + 0xe);
    uVar9 = *(undefined8 *)(puVar54 + 0x1e);
    *(undefined8 *)(pmVar30->randbytes + 0x30) = *(undefined8 *)(puVar54 + 0x16);
    *(undefined8 *)(pmVar30->randbytes + 0x38) = uVar9;
    *(undefined8 *)(pmVar30->randbytes + 0x20) = uVar7;
    *(undefined8 *)(pmVar30->randbytes + 0x28) = uVar8;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x8eb,"server hello, random bytes",puVar54 + 6,0x20);
    if (ssl->handshake->resume != 0) goto LAB_0011506a;
    if ((ssl->renego_status == 0) && (ssl->session_negotiate->id_len != 0)) {
      p_Var3 = ssl->conf->f_get_cache;
      if (p_Var3 == (_func_int_void_ptr_mbedtls_ssl_session_ptr *)0x0) goto LAB_00115986;
      iVar17 = (*p_Var3)(ssl->conf->p_cache,ssl->session_negotiate);
      if (iVar17 == 0) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0x8fa,"session successfully restored from cache");
        ssl->handshake->resume = 1;
      }
      else if (ssl->handshake->resume == 0) goto LAB_00115986;
LAB_0011506a:
      sStackY_210 = ssl->session_negotiate->id_len;
      ssl->state = 0xc;
      iVar17 = mbedtls_ssl_derive_keys(ssl);
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_ssl_derive_keys";
        iVar16 = 0x923;
        goto LAB_00114f55;
      }
    }
    else {
LAB_00115986:
      ssl->state = ssl->state + 1;
      tVar24 = time((time_t *)0x0);
      pmVar27 = ssl->session_negotiate;
      pmVar27->start = tVar24;
      if (ssl->handshake->new_session_ticket == 0) {
        pmVar27->id_len = 0x20;
        sStackY_210 = 0x20;
        iVar17 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar27->id,0x20);
        if (iVar17 != 0) {
          return iVar17;
        }
      }
      else {
        pmVar27->id[8] = '\0';
        pmVar27->id[9] = '\0';
        pmVar27->id[10] = '\0';
        pmVar27->id[0xb] = '\0';
        pmVar27->id[0xc] = '\0';
        pmVar27->id[0xd] = '\0';
        pmVar27->id[0xe] = '\0';
        pmVar27->id[0xf] = '\0';
        pmVar27->id[0x10] = '\0';
        pmVar27->id[0x11] = '\0';
        pmVar27->id[0x12] = '\0';
        pmVar27->id[0x13] = '\0';
        pmVar27->id[0x14] = '\0';
        pmVar27->id[0x15] = '\0';
        pmVar27->id[0x16] = '\0';
        pmVar27->id[0x17] = '\0';
        pmVar27->id_len = 0;
        pmVar27->id[0] = '\0';
        pmVar27->id[1] = '\0';
        pmVar27->id[2] = '\0';
        pmVar27->id[3] = '\0';
        pmVar27->id[4] = '\0';
        pmVar27->id[5] = '\0';
        pmVar27->id[6] = '\0';
        pmVar27->id[7] = '\0';
        pmVar27->id[0x18] = '\0';
        pmVar27->id[0x19] = '\0';
        pmVar27->id[0x1a] = '\0';
        pmVar27->id[0x1b] = '\0';
        pmVar27->id[0x1c] = '\0';
        pmVar27->id[0x1d] = '\0';
        pmVar27->id[0x1e] = '\0';
        pmVar27->id[0x1f] = '\0';
        sStackY_210 = 0;
      }
    }
    puVar54[0x26] = (uchar)ssl->session_negotiate->id_len;
    memcpy(puVar54 + 0x27,ssl->session_negotiate->id,ssl->session_negotiate->id_len);
    sVar32 = ssl->session_negotiate->id_len;
    puVar46 = puVar54 + sVar32 + 0x27;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x934,"server hello, session id len.: %d",sStackY_210);
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x935,"server hello, session id",puVar54 + 0x27,sStackY_210);
    pcVar44 = "a";
    if (ssl->handshake->resume == 0) {
      pcVar44 = "no";
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x937,"%s session has been resumed",pcVar44);
    *puVar46 = *(uchar *)((long)&ssl->session_negotiate->ciphersuite + 1);
    puVar54[sVar32 + 0x28] = (uchar)ssl->session_negotiate->ciphersuite;
    puVar54[sVar32 + 0x29] = (uchar)ssl->session_negotiate->compression;
    pcVar44 = mbedtls_ssl_get_ciphersuite_name(ssl->session_negotiate->ciphersuite);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x93e,"server hello, chosen ciphersuite: %s",pcVar44);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x940,"server hello, compress alg.: 0x%02X",
               (ulong)(uint)ssl->session_negotiate->compression);
    puVar40 = puVar54 + sVar32 + 0x2c;
    if (ssl->secure_renegotiation == 1) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x7c3,"server hello, secure renegotiation extension");
      (puVar54 + sVar32 + 0x2c)[0] = 0xff;
      (puVar54 + sVar32 + 0x2c)[1] = '\x01';
      iVar17 = ssl->renego_status;
      puVar54[sVar32 + 0x2e] = '\0';
      if (iVar17 == 0) {
        (puVar54 + sVar32 + 0x2f)[0] = '\x01';
        (puVar54 + sVar32 + 0x2f)[1] = '\0';
        puVar46 = puVar54 + sVar32 + 0x31;
      }
      else {
        puVar54[sVar32 + 0x2f] = (char)ssl->verify_data_len * '\x02' + '\x01';
        puVar54[sVar32 + 0x30] = (char)ssl->verify_data_len * '\x02';
        memcpy(puVar54 + sVar32 + 0x31,ssl->peer_verify_data,ssl->verify_data_len);
        sVar31 = ssl->verify_data_len;
        memcpy(puVar46 + sVar31 + 10,ssl->own_verify_data,sVar31);
        puVar46 = puVar46 + sVar31 + 10 + ssl->verify_data_len;
      }
      lVar49 = (long)puVar46 - (long)puVar40;
    }
    else {
      lVar49 = 0;
    }
    pmVar27 = ssl->session_negotiate;
    if (pmVar27->mfl_code == '\0') {
      lVar52 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x7ec,"server hello, max_fragment_length extension");
      puVar46 = puVar40 + lVar49;
      puVar46[0] = '\0';
      puVar46[1] = '\x01';
      puVar46[2] = '\0';
      puVar46[3] = '\x01';
      puVar54[lVar49 + sVar32 + 0x30] = ssl->session_negotiate->mfl_code;
      pmVar27 = ssl->session_negotiate;
      lVar52 = 5;
    }
    if (pmVar27->trunc_hmac == 0) {
      lVar51 = 0;
    }
    else {
      lVar51 = 4;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x74c,"server hello, adding truncated hmac extension");
      puVar46 = puVar40 + lVar52 + lVar49;
      puVar46[0] = '\0';
      puVar46[1] = '\x04';
      puVar46[2] = '\0';
      puVar46[3] = '\0';
      pmVar27 = ssl->session_negotiate;
    }
    lVar51 = lVar51 + lVar52 + lVar49;
    if ((((pmVar27->encrypt_then_mac == 0) || (ssl->minor_ver == 0)) ||
        (pmVar28 = mbedtls_ssl_ciphersuite_from_id(pmVar27->ciphersuite),
        pmVar28 == (mbedtls_ssl_ciphersuite_t *)0x0)) ||
       ((pmVar29 = mbedtls_cipher_info_from_type(pmVar28->cipher),
        pmVar29 == (mbedtls_cipher_info_t *)0x0 || (pmVar29->mode != MBEDTLS_MODE_CBC)))) {
      lVar49 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x777,"server hello, adding encrypt then mac extension");
      puVar46 = puVar40 + lVar51;
      puVar46[0] = '\0';
      puVar46[1] = '\x16';
      puVar46[2] = '\0';
      puVar46[3] = '\0';
      lVar49 = 4;
    }
    lVar49 = lVar49 + lVar51;
    pmVar30 = ssl->handshake;
    if ((pmVar30->extended_ms == 0) || (ssl->minor_ver == 0)) {
      lVar52 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x792,"server hello, adding extended master secret extension");
      puVar46 = puVar40 + lVar49;
      puVar46[0] = '\0';
      puVar46[1] = '\x17';
      puVar46[2] = '\0';
      puVar46[3] = '\0';
      pmVar30 = ssl->handshake;
      lVar52 = 4;
    }
    lVar52 = lVar52 + lVar49;
    if (pmVar30->new_session_ticket == 0) {
      lVar49 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x7ab,"server hello, adding session ticket extension");
      puVar46 = puVar40 + lVar52;
      puVar46[0] = '\0';
      puVar46[1] = '#';
      puVar46[2] = '\0';
      puVar46[3] = '\0';
      pmVar30 = ssl->handshake;
      lVar49 = 4;
    }
    lVar49 = lVar49 + lVar52;
    if ((pmVar30->cli_exts & 1) == 0) {
      lVar52 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x80a,"server hello, supported_point_formats extension");
      puVar46 = puVar40 + lVar49;
      puVar46[0] = '\0';
      puVar46[1] = '\v';
      puVar46[2] = '\0';
      puVar46[3] = '\x02';
      (puVar54 + lVar49 + sVar32 + 0x30)[0] = '\x01';
      (puVar54 + lVar49 + sVar32 + 0x30)[1] = '\0';
      lVar52 = 6;
    }
    lVar52 = lVar52 + lVar49;
    if (ssl->alpn_chosen == (char *)0x0) {
      lVar49 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x84f,"server hello, adding alpn extension");
      puVar46 = puVar40 + lVar52 + 7;
      puVar46[-7] = '\0';
      puVar46[-6] = '\x10';
      sVar31 = strlen(ssl->alpn_chosen);
      lVar49 = sVar31 + 7;
      puVar54[lVar52 + sVar32 + 0x2e] = (uchar)((uint)((int)sVar31 + 3) >> 8);
      cVar6 = (char)lVar49;
      puVar46[-4] = cVar6 + 0xfc;
      puVar54[lVar52 + sVar32 + 0x30] = (uchar)((uint)((int)sVar31 + 1) >> 8);
      puVar46[-2] = cVar6 + 0xfa;
      puVar46[-1] = cVar6 + 0xf9;
      memcpy(puVar46,ssl->alpn_chosen,sVar31);
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x977,"server hello, total extension length: %d",lVar49 + lVar52);
    lVar49 = lVar49 + lVar52;
    if (lVar49 == 0) {
      puVar40 = puVar54 + sVar32 + 0x2a;
    }
    else {
      *(ushort *)(puVar54 + sVar32 + 0x2a) = (ushort)lVar49 << 8 | (ushort)lVar49 >> 8;
      puVar40 = puVar40 + lVar49;
    }
    ssl->out_msglen = (long)puVar40 - (long)puVar54;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x02';
    iVar17 = mbedtls_ssl_write_record(ssl);
    pcVar44 = "<= write server hello";
    iVar16 = 0x98a;
LAB_00116012:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,iVar16,pcVar44);
    return iVar17;
  case 3:
    iVar17 = mbedtls_ssl_write_certificate(ssl);
    return iVar17;
  case 4:
    puVar46 = ssl->out_msg;
    pmVar28 = ssl->transform_negotiate->ciphersuite_info;
    puVar54 = puVar46 + 4;
    lVar49 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xa7f,"=> write server key exchange");
    mVar19 = pmVar28->key_exchange;
    puVar40 = puVar54;
    if (mVar19 < MBEDTLS_KEY_EXCHANGE_ECJPAKE) {
      if ((0xa2U >> (mVar19 & 0x1f) & 1) != 0) {
        pcVar44 = "<= skip write server key exchange";
        iVar17 = 0xa88;
LAB_00115841:
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,iVar17,pcVar44);
        ssl->state = ssl->state + 1;
        return 0;
      }
      if ((0x140U >> (mVar19 & 0x1f) & 1) == 0) {
        if ((0x600U >> (mVar19 & 0x1f) & 1) != 0) {
          pmVar23 = mbedtls_ssl_own_key(ssl);
          iVar17 = mbedtls_pk_can_do(pmVar23,MBEDTLS_PK_ECKEY);
          if (iVar17 == 0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0xa59,"server key not ECDH capable");
          }
          else {
            pmVar30 = ssl->handshake;
            pmVar23 = mbedtls_ssl_own_key(ssl);
            iVar17 = mbedtls_ecdh_get_params
                               (&pmVar30->ecdh_ctx,(mbedtls_ecp_keypair *)pmVar23->pk_ctx,
                                MBEDTLS_ECDH_OURS);
            if (iVar17 != 0) {
              mbedtls_debug_print_ret
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                         ,0xa61,"mbedtls_ecdh_get_params",iVar17);
            }
          }
          pcVar44 = "<= skip write server key exchange";
          iVar17 = 0xa95;
          goto LAB_00115841;
        }
      }
      else {
        puVar46[4] = '\0';
        puVar46[5] = '\0';
        lVar49 = 2;
        mVar19 = pmVar28->key_exchange;
        puVar40 = puVar46 + 6;
      }
    }
    if ((mVar19 | MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA) == MBEDTLS_KEY_EXCHANGE_DHE_PSK) {
      pmVar37 = ssl->conf;
      if (((pmVar37->dhm_P).p == (mbedtls_mpi_uint *)0x0) ||
         ((pmVar37->dhm_G).p == (mbedtls_mpi_uint *)0x0)) {
        pcVar44 = "no DH parameters set";
        iVar16 = 1;
        line = 0xac4;
        goto LAB_00115417;
      }
      iVar17 = mbedtls_mpi_copy(&(ssl->handshake->dhm_ctx).P,&pmVar37->dhm_P);
      if ((iVar17 != 0) ||
         (iVar17 = mbedtls_mpi_copy(&(ssl->handshake->dhm_ctx).G,&ssl->conf->dhm_G), iVar17 != 0)) {
        pcVar44 = "mbedtls_mpi_copy";
        iVar16 = 0xad4;
        goto LAB_00114f55;
      }
      pmVar30 = ssl->handshake;
      sVar32 = mbedtls_mpi_size(&(pmVar30->dhm_ctx).P);
      iVar17 = mbedtls_dhm_make_params
                         (&pmVar30->dhm_ctx,(int)sVar32,puVar40,&len,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      sVar32 = len;
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_dhm_make_params";
        iVar16 = 0xadc;
        goto LAB_00114f55;
      }
      puVar46 = puVar40 + len;
      lVar49 = lVar49 + len;
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xae6,"DHM: X ",&(ssl->handshake->dhm_ctx).X);
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xae7,"DHM: P ",&(ssl->handshake->dhm_ctx).P);
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xae8,"DHM: G ",&(ssl->handshake->dhm_ctx).G);
      mbedtls_debug_print_mpi
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xae9,"DHM: GX",&(ssl->handshake->dhm_ctx).GX);
      mVar19 = pmVar28->key_exchange;
      puVar54 = puVar40;
    }
    else {
      sVar32 = 0;
      puVar46 = puVar40;
    }
    local_1f0 = puVar46;
    if ((mVar19 < MBEDTLS_KEY_EXCHANGE_ECDH_RSA) && ((0x118U >> (mVar19 & 0x1f) & 1) != 0)) {
      ppmVar34 = (mbedtls_ecp_curve_info **)0x0;
      for (pmVar25 = ssl->conf->curve_list; *pmVar25 != MBEDTLS_ECP_DP_NONE; pmVar25 = pmVar25 + 1)
      {
        for (ppmVar34 = ssl->handshake->curves; pmVar35 = *ppmVar34,
            pmVar35 != (mbedtls_ecp_curve_info *)0x0; ppmVar34 = ppmVar34 + 1) {
          if (pmVar35->grp_id == *pmVar25) goto LAB_001162ff;
        }
      }
      if ((ppmVar34 == (mbedtls_ecp_curve_info **)0x0) ||
         (pmVar35 = *ppmVar34, pmVar35 == (mbedtls_ecp_curve_info *)0x0)) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xb07,"no matching curve for ECDHE");
        return -0x7380;
      }
LAB_001162ff:
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xb0b,"ECDHE curve: %s",pmVar35->name);
      iVar17 = mbedtls_ecp_group_load(&(ssl->handshake->ecdh_ctx).grp,(*ppmVar34)->grp_id);
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_ecp_group_load";
        iVar16 = 0xb10;
        goto LAB_00114f55;
      }
      iVar17 = mbedtls_ecdh_make_params
                         (&ssl->handshake->ecdh_ctx,&len,puVar46,0x4000 - lVar49,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_ecdh_make_params";
        iVar16 = 0xb18;
        goto LAB_00114f55;
      }
      local_1f0 = puVar46 + len;
      lVar49 = lVar49 + len;
      mbedtls_debug_print_ecp
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xb22,"ECDH: Q ",&(ssl->handshake->ecdh_ctx).Q);
      mVar19 = pmVar28->key_exchange;
      sVar32 = len;
      puVar54 = puVar46;
    }
    if (mVar19 - MBEDTLS_KEY_EXCHANGE_DHE_RSA < 3) {
      signature_len = 0;
      if (ssl->minor_ver == 3) {
        mVar20 = mbedtls_ssl_md_alg_from_hash((uchar)ssl->handshake->sig_alg);
        if (mVar20 == MBEDTLS_MD_NONE) {
          pcVar44 = "should never happen";
          iVar17 = 0xb3c;
          goto LAB_001157f3;
        }
LAB_00116444:
        pmVar33 = mbedtls_md_info_from_type(mVar20);
        mbedtls_md_init((mbedtls_md_context_t *)&mbedtls_sha1);
        iVar17 = mbedtls_md_setup((mbedtls_md_context_t *)&mbedtls_sha1,pmVar33,0);
        if (iVar17 != 0) {
          pcVar44 = "mbedtls_md_setup";
          iVar16 = 0xb90;
          goto LAB_00114f55;
        }
        mbedtls_md_starts((mbedtls_md_context_t *)&mbedtls_sha1);
        mbedtls_md_update((mbedtls_md_context_t *)&mbedtls_sha1,ssl->handshake->randbytes,0x40);
        mbedtls_md_update((mbedtls_md_context_t *)&mbedtls_sha1,puVar54,sVar32);
        mbedtls_md_finish((mbedtls_md_context_t *)&mbedtls_sha1,hash);
        mbedtls_md_free((mbedtls_md_context_t *)&mbedtls_sha1);
        pmVar33 = mbedtls_md_info_from_type(mVar20);
        bVar12 = mbedtls_md_get_size(pmVar33);
        sVar32 = (size_t)bVar12;
        hash_len = 0;
      }
      else {
        if (mVar19 == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA) {
          mVar20 = MBEDTLS_MD_SHA1;
          goto LAB_00116444;
        }
        mbedtls_md5_init(&mbedtls_md5);
        mbedtls_sha1_init(&mbedtls_sha1);
        mbedtls_md5_starts(&mbedtls_md5);
        mbedtls_md5_update(&mbedtls_md5,ssl->handshake->randbytes,0x40);
        mbedtls_md5_update(&mbedtls_md5,puVar54,sVar32);
        mbedtls_md5_finish(&mbedtls_md5,hash);
        mbedtls_sha1_starts(&mbedtls_sha1);
        mbedtls_sha1_update(&mbedtls_sha1,ssl->handshake->randbytes,0x40);
        mbedtls_sha1_update(&mbedtls_sha1,puVar54,sVar32);
        mbedtls_sha1_finish(&mbedtls_sha1,hash + 0x10);
        mbedtls_md5_free(&mbedtls_md5);
        mbedtls_sha1_free(&mbedtls_sha1);
        mVar20 = MBEDTLS_MD_NONE;
        sVar32 = 0x24;
        hash_len = sVar32;
      }
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xba3,"parameters hash",hash,sVar32);
      pmVar23 = mbedtls_ssl_own_key(ssl);
      if (pmVar23 == (mbedtls_pk_context *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xbaa,"got no private key");
        return -0x7600;
      }
      if (ssl->minor_ver == 3) {
        *local_1f0 = (uchar)ssl->handshake->sig_alg;
        pmVar23 = mbedtls_ssl_own_key(ssl);
        uVar13 = mbedtls_ssl_sig_from_pk(pmVar23);
        local_1f0[1] = uVar13;
        local_1f0 = local_1f0 + 2;
        lVar49 = lVar49 + 2;
      }
      pmVar23 = mbedtls_ssl_own_key(ssl);
      iVar17 = mbedtls_pk_sign(pmVar23,mVar20,hash,hash_len,local_1f0 + 2,&signature_len,
                               (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                               ssl->conf->p_rng);
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_pk_sign";
        iVar16 = 0xbbc;
        goto LAB_00114f55;
      }
      *local_1f0 = signature_len._1_1_;
      local_1f0[1] = (uchar)signature_len;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xbc4,"my signature",local_1f0 + 2,signature_len);
      lVar49 = lVar49 + signature_len + 2;
    }
    ssl->out_msglen = lVar49 + 4;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\f';
    ssl->state = ssl->state + 1;
    iVar17 = mbedtls_ssl_write_record(ssl);
    if (iVar17 == 0) {
      pcVar44 = "<= write server key exchange";
      iVar17 = 0;
      iVar16 = 2;
      line = 0xbd8;
      goto LAB_00115417;
    }
    pcVar44 = "mbedtls_ssl_write_record";
    iVar16 = 0xbd4;
    goto LAB_00114f55;
  case 5:
    pmVar28 = ssl->transform_negotiate->ciphersuite_info;
    puVar54 = ssl->out_msg;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x9b5,"=> write certificate request");
    ssl->state = ssl->state + 1;
    uVar18 = ssl->handshake->sni_authmode;
    if (uVar18 == 3) {
      uVar18 = *(uint *)&ssl->conf->field_0x174 >> 2 & 3;
    }
    mVar19 = pmVar28->key_exchange;
    if (((mVar19 - MBEDTLS_KEY_EXCHANGE_PSK < 4) || (mVar19 == MBEDTLS_KEY_EXCHANGE_ECJPAKE)) ||
       (uVar18 == 0)) {
      pcVar44 = "<= skip write certificate request";
      iVar17 = 0;
      iVar16 = 2;
      line = 0x9c7;
      goto LAB_00115417;
    }
    puVar40 = ssl->out_msg;
    puVar40[6] = '@';
    puVar40[4] = '\x02';
    puVar40[5] = '\x01';
    puVar46 = puVar40 + 7;
    if (ssl->minor_ver == 3) {
      lVar49 = 0;
      for (piVar45 = ssl->conf->sig_hashes; *piVar45 != 0; piVar45 = piVar45 + 1) {
        bVar12 = mbedtls_ssl_hash_from_md_alg(*piVar45);
        if ((bVar12 != 0) &&
           (iVar17 = mbedtls_ssl_set_calc_verify_md(ssl,(uint)bVar12), iVar17 == 0)) {
          puVar40[lVar49 + 9] = bVar12;
          puVar40[lVar49 + 10] = '\x01';
          puVar40[lVar49 + 0xb] = bVar12;
          puVar40[lVar49 + 0xc] = '\x03';
          lVar49 = lVar49 + 4;
        }
      }
      *(ushort *)(puVar40 + 7) = (ushort)lVar49 << 8 | (ushort)lVar49 >> 8;
      puVar46 = puVar46 + lVar49 + 2;
      local_1e0 = (mbedtls_ssl_key_cert *)(lVar49 + 2);
    }
    else {
      local_1e0 = (mbedtls_ssl_key_cert *)0x0;
    }
    pmVar39 = ssl->handshake->sni_ca_chain;
    if (pmVar39 == (mbedtls_x509_crt *)0x0) {
      pmVar39 = ssl->conf->ca_chain;
    }
    lVar49 = 0;
    while( true ) {
      puVar47 = (ushort *)(puVar46 + 2);
      if ((pmVar39 == (mbedtls_x509_crt *)0x0) || (pmVar39->version == 0)) goto LAB_001155c7;
      uVar26 = (long)(puVar54 + 0x4000) - (long)puVar47;
      if ((puVar54 + 0x4000 < puVar47) ||
         ((uVar36 = (pmVar39->subject_raw).len, uVar26 < uVar36 || (uVar26 < uVar36 + 2)))) break;
      buf = puVar46 + 4;
      *puVar47 = (ushort)uVar36 << 8 | (ushort)uVar36 >> 8;
      memcpy(buf,(pmVar39->subject_raw).p,uVar36);
      puVar46 = (uchar *)((long)puVar47 + uVar36);
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xa38,"requested DN",buf,uVar36);
      lVar49 = lVar49 + uVar36 + 2;
      pmVar39 = pmVar39->next;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xa2f,"skipping CAs: buffer too short");
LAB_001155c7:
    ssl->out_msglen = (long)puVar47 - (long)puVar40;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\r';
    ssl->out_msg[(long)local_1e0 + 7] = (uchar)((ulong)lVar49 >> 8);
    ssl->out_msg[(long)local_1e0 + 8] = (uchar)lVar49;
    iVar17 = mbedtls_ssl_write_record(ssl);
    pcVar44 = "<= write certificate request";
    iVar16 = 0xa46;
    goto LAB_00116012;
  case 6:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xbe1,"=> write server hello done");
    ssl->out_msglen = 4;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x0e';
    ssl->state = ssl->state + 1;
    if ((ssl->conf->field_0x174 & 2) != 0) {
      mbedtls_ssl_send_flight_completed(ssl);
    }
    iVar17 = mbedtls_ssl_write_record(ssl);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_write_record";
      iVar16 = 0xbf0;
      goto LAB_00114f55;
    }
    pcVar44 = "<= write server hello done";
    iVar17 = 0;
    iVar16 = 2;
    line = 0xbf4;
    goto LAB_00115417;
  case 7:
    iVar17 = mbedtls_ssl_parse_certificate(ssl);
    return iVar17;
  case 8:
    pmVar28 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xcd4,"=> parse client key exchange");
    iVar17 = mbedtls_ssl_read_record(ssl);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_read_record";
      iVar16 = 0xcd8;
      goto LAB_00114f55;
    }
    puVar54 = ssl->in_msg;
    uVar26 = (ulong)(*(uint *)&ssl->conf->field_0x174 & 2);
    mbedtls_sha1.total = (uint32_t  [2])((long)puVar54 + uVar26 * 4 + 4);
    if (ssl->in_msgtype != 0x16) {
      pcVar44 = "bad client key exchange message";
      iVar17 = 0xce1;
LAB_00115869:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,iVar17,pcVar44);
      return -0x7c00;
    }
    if (*puVar54 != '\x10') {
      pcVar44 = "bad client key exchange message";
      iVar17 = 0xce7;
      goto LAB_00115869;
    }
    if (9 < pmVar28->key_exchange - MBEDTLS_KEY_EXCHANGE_RSA) {
      pcVar44 = "should never happen";
      iVar17 = 0xdb5;
      goto LAB_001157f3;
    }
    break;
  case 9:
    pmVar28 = ssl->transform_negotiate->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xdee,"=> parse certificate verify");
    mVar19 = pmVar28->key_exchange;
    if (((mVar19 < (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK|MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA)) &&
        ((0x9e0U >> (mVar19 & 0x1f) & 1) != 0)) ||
       (ssl->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0)) {
      pcVar44 = "<= skip parse certificate verify";
      iVar17 = 0xdf7;
      goto LAB_00115841;
    }
    do {
      iVar17 = mbedtls_ssl_read_record_layer(ssl);
      if (iVar17 != 0) {
        pcVar44 = "mbedtls_ssl_read_record_layer";
        iVar16 = 0xe01;
        goto LAB_00114f55;
      }
      iVar17 = mbedtls_ssl_handle_message_type(ssl);
    } while (iVar17 == -0x6680);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_handle_message_type";
      iVar16 = 0xe0b;
      goto LAB_00114f55;
    }
    ssl->state = ssl->state + 1;
    if ((ssl->in_msgtype != 0x16) || (*ssl->in_msg != '\x0f')) {
      pcVar44 = "bad certificate verify message";
      iVar17 = 0xe15;
      goto LAB_00115c89;
    }
    lVar49 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8;
    uVar26 = lVar49 + 4;
    if (ssl->minor_ver == 3) {
      if (ssl->in_hslen < (uVar26 | 2)) {
        pcVar44 = "bad certificate verify message";
        iVar17 = 0xe39;
        goto LAB_00115c89;
      }
      mVar20 = mbedtls_ssl_md_alg_from_hash(ssl->in_msg[uVar26]);
      if ((mVar20 == MBEDTLS_MD_NONE) ||
         (iVar17 = mbedtls_ssl_set_calc_verify_md(ssl,(uint)ssl->in_msg[uVar26]), iVar17 != 0)) {
        pcVar44 = "peer not adhering to requested sig_alg for verify message";
        iVar17 = 0xe45;
        goto LAB_00115c89;
      }
      mVar21 = mbedtls_ssl_pk_alg_from_sig(ssl->in_msg[lVar49 + 5]);
      if (mVar21 == MBEDTLS_PK_NONE) {
        pcVar44 = "peer not adhering to requested sig_alg for verify message";
        iVar17 = 0xe5a;
        goto LAB_00115c89;
      }
      iVar17 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,mVar21);
      if (iVar17 == 0) {
        pcVar44 = "sig_alg doesn\'t match cert key";
        iVar17 = 0xe63;
        goto LAB_00115c89;
      }
      hash_00 = (mbedtls_sha1_context *)
                (mbedtls_sha1.total + (ulong)(mVar20 == MBEDTLS_MD_SHA1) * 4);
      sVar32 = 0;
      uVar26 = uVar26 | 2;
    }
    else {
      mVar20 = MBEDTLS_MD_SHA1;
      iVar17 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,MBEDTLS_PK_ECDSA);
      if (iVar17 == 0) {
        mVar20 = MBEDTLS_MD_NONE;
        sVar32 = 0x24;
        hash_00 = &mbedtls_sha1;
      }
      else {
        sVar32 = 0x14;
        hash_00 = (mbedtls_sha1_context *)(mbedtls_sha1.state + 2);
      }
    }
    uVar36 = uVar26 + 2;
    if (ssl->in_hslen < uVar36) {
      pcVar44 = "bad certificate verify message";
      iVar17 = 0xe72;
    }
    else {
      uVar26 = (ulong)(ushort)(*(ushort *)(ssl->in_msg + uVar26) << 8 |
                              *(ushort *)(ssl->in_msg + uVar26) >> 8);
      if (uVar36 + uVar26 == ssl->in_hslen) {
        (*ssl->handshake->calc_verify)(ssl,(uchar *)&mbedtls_sha1);
        iVar17 = mbedtls_pk_verify(&ssl->session_negotiate->peer_cert->pk,mVar20,(uchar *)hash_00,
                                   sVar32,ssl->in_msg + uVar36,uVar26);
        if (iVar17 != 0) {
          pcVar44 = "mbedtls_pk_verify";
          iVar16 = 0xe86;
          goto LAB_00114f55;
        }
        mbedtls_ssl_update_handshake_status(ssl);
        pcVar44 = "<= parse certificate verify";
        iVar17 = 0;
        iVar16 = 2;
        line = 0xe8c;
        goto LAB_00115417;
      }
      pcVar44 = "bad certificate verify message";
      iVar17 = 0xe7b;
    }
LAB_00115c89:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,iVar17,pcVar44);
    return -0x7d80;
  case 10:
    iVar17 = mbedtls_ssl_parse_change_cipher_spec(ssl);
    return iVar17;
  case 0xb:
    iVar17 = mbedtls_ssl_parse_finished(ssl);
    return iVar17;
  case 0xc:
    if (ssl->handshake->new_session_ticket == 0) {
      iVar17 = mbedtls_ssl_write_change_cipher_spec(ssl);
      return iVar17;
    }
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xe9e,"=> write new session ticket");
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x04';
    iVar17 = (*ssl->conf->f_ticket_write)
                       (ssl->conf->p_ticket,ssl->session_negotiate,ssl->out_msg + 10,
                        ssl->out_msg + 0x4000,(size_t *)&mbedtls_sha1,mbedtls_md5.total);
    if (iVar17 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xeb4,"mbedtls_ssl_ticket_write",iVar17);
      mbedtls_sha1.total[0] = 0;
      mbedtls_sha1.total[1] = 0;
    }
    ssl->out_msg[4] = (uchar)(mbedtls_md5.total[0] >> 0x18);
    ssl->out_msg[5] = (uchar)(mbedtls_md5.total[0] >> 0x10);
    ssl->out_msg[6] = (uchar)(mbedtls_md5.total[0] >> 8);
    ssl->out_msg[7] = (uchar)mbedtls_md5.total[0];
    ssl->out_msg[8] = mbedtls_sha1.total[0]._1_1_;
    ssl->out_msg[9] = (uchar)mbedtls_sha1.total[0];
    ssl->out_msglen = (long)mbedtls_sha1.total + 10;
    ssl->handshake->new_session_ticket = 0;
    iVar17 = mbedtls_ssl_write_record(ssl);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_write_record";
      iVar16 = 0xeca;
      goto LAB_00114f55;
    }
    pcVar44 = "<= write new session ticket";
    iVar16 = 2;
    line = 0xece;
    iVar17 = 0;
    goto LAB_00115417;
  case 0xd:
    iVar17 = mbedtls_ssl_write_finished(ssl);
    return iVar17;
  case 0xe:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xf47,"handshake: done");
    ssl->state = 0xf;
    return 0;
  case 0xf:
    mbedtls_ssl_handshake_wrapup(ssl);
    return 0;
  default:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xf50,"invalid state %d");
    return -0x7100;
  case 0x12:
    return -0x6a80;
  }
  auVar50 = (uint32_t  [2])((long)puVar54 + ssl->in_hslen);
  switch(pmVar28->key_exchange) {
  case MBEDTLS_KEY_EXCHANGE_RSA:
    iVar17 = ssl_parse_encrypted_pms(ssl,(uchar *)mbedtls_sha1.total,(uchar *)auVar50,0);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_parse_encrypted_pms_secret";
      iVar16 = 0xd98;
      goto LAB_00114f55;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
    iVar17 = ssl_parse_client_dh_public(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar50);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_dh_public";
      iVar16 = 0xcf0;
      goto LAB_00114f55;
    }
    if (mbedtls_sha1.total != auVar50) {
      pcVar44 = "bad client key exchange";
      iVar17 = 0xcf6;
      goto LAB_00115869;
    }
    pmVar30 = ssl->handshake;
    iVar17 = mbedtls_dhm_calc_secret
                       (&pmVar30->dhm_ctx,pmVar30->premaster,0x424,&pmVar30->pmslen,
                        (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_dhm_calc_secret";
      iVar16 = 0xd00;
      goto LAB_001160fe;
    }
    X = &(ssl->handshake->dhm_ctx).K;
    pcVar44 = "DHM: K ";
    iVar17 = 0xd04;
    goto LAB_0011677c;
  default:
    iVar17 = mbedtls_ecdh_read_public
                       (&ssl->handshake->ecdh_ctx,(uchar *)mbedtls_sha1.total,
                        ssl->in_hslen - (uVar26 * 4 + 4));
    if (iVar17 != 0) {
      iVar16 = 0xd14;
LAB_0011522a:
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,iVar16,"mbedtls_ecdh_read_public",iVar17);
      return -0x7c80;
    }
    mbedtls_debug_print_ecp
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xd18,"ECDH: Qp ",&(ssl->handshake->ecdh_ctx).Qp);
    pmVar30 = ssl->handshake;
    iVar17 = mbedtls_ecdh_calc_secret
                       (&pmVar30->ecdh_ctx,&pmVar30->pmslen,pmVar30->premaster,0x400,
                        (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ecdh_calc_secret";
      iVar16 = 0xd20;
LAB_001160fe:
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,iVar16,pcVar44,iVar17);
      return -32000;
    }
    X = &(ssl->handshake->ecdh_ctx).z;
    pcVar44 = "ECDH: z  ";
    iVar17 = 0xd24;
LAB_0011677c:
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,iVar17,pcVar44,X);
    break;
  case MBEDTLS_KEY_EXCHANGE_PSK:
    iVar17 = ssl_parse_client_psk_identity(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar50);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_psk_identity";
      iVar16 = 0xd30;
      goto LAB_00114f55;
    }
    if (mbedtls_sha1.total != auVar50) {
      pcVar44 = "bad client key exchange";
      iVar17 = 0xd36;
      goto LAB_00115869;
    }
    iVar17 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar28->key_exchange);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_psk_derive_premaster";
      iVar16 = 0xd3d;
      goto LAB_00114f55;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
    iVar17 = ssl_parse_client_psk_identity(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar50);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_psk_identity";
      iVar16 = 0xd60;
      goto LAB_00114f55;
    }
    iVar17 = ssl_parse_client_dh_public(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar50);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_dh_public";
      iVar16 = 0xd65;
      goto LAB_00114f55;
    }
    if (mbedtls_sha1.total != auVar50) {
      pcVar44 = "bad client key exchange";
      iVar17 = 0xd6b;
      goto LAB_00115869;
    }
    iVar17 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar28->key_exchange);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_psk_derive_premaster";
      iVar16 = 0xd72;
      goto LAB_00114f55;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
    iVar17 = ssl_parse_client_psk_identity(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar50);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_psk_identity";
      iVar16 = 0xd48;
      goto LAB_00114f55;
    }
    iVar17 = ssl_parse_encrypted_pms(ssl,(uchar *)mbedtls_sha1.total,(uchar *)auVar50,2);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_encrypted_pms";
      iVar16 = 0xd4e;
      goto LAB_00114f55;
    }
    iVar17 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar28->key_exchange);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_psk_derive_premaster";
      iVar16 = 0xd55;
      goto LAB_00114f55;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
    iVar17 = ssl_parse_client_psk_identity(ssl,(uchar **)&mbedtls_sha1,(uchar *)auVar50);
    if (iVar17 != 0) {
      pcVar44 = "ssl_parse_client_psk_identity";
      iVar16 = 0xd7d;
      goto LAB_00114f55;
    }
    iVar17 = mbedtls_ecdh_read_public
                       (&ssl->handshake->ecdh_ctx,(uchar *)mbedtls_sha1.total,
                        (long)auVar50 - (long)mbedtls_sha1.total);
    if (iVar17 != 0) {
      iVar16 = 0xd84;
      goto LAB_0011522a;
    }
    mbedtls_debug_print_ecp
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xd88,"ECDH: Qp ",&(ssl->handshake->ecdh_ctx).Qp);
    iVar17 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar28->key_exchange);
    if (iVar17 != 0) {
      pcVar44 = "mbedtls_ssl_psk_derive_premaster";
      iVar16 = 0xd8d;
      goto LAB_00114f55;
    }
  }
  iVar17 = mbedtls_ssl_derive_keys(ssl);
  if (iVar17 != 0) {
    pcVar44 = "mbedtls_ssl_derive_keys";
    iVar16 = 0xdbb;
LAB_00114f55:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,iVar16,pcVar44,iVar17);
    return iVar17;
  }
  ssl->state = ssl->state + 1;
  pcVar44 = "<= parse client key exchange";
  iVar17 = 0;
  iVar16 = 2;
  line = 0xdc1;
LAB_00115417:
  mbedtls_debug_print_msg
            (ssl,iVar16,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,line,pcVar44);
  return iVar17;
LAB_00117c80:
  if (uVar38 <= uVar26) goto LAB_00117d58;
  if ((pbVar48[uVar26 + uVar36 + lVar49 + 0x29] == 0x56) &&
     (pbVar48[uVar26 + uVar36 + lVar49 + 0x2a] == 0)) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x6ac,"received FALLBACK_SCSV");
    if (ssl->minor_ver < (int)(uint)ssl->conf->max_minor_ver) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x6b0,"inapropriate fallback");
      uVar13 = 'V';
LAB_00117d4a:
      mbedtls_ssl_send_alert_message(ssl,'\x02',uVar13);
      return -0x7900;
    }
    goto LAB_00117d58;
  }
  uVar26 = uVar26 + 2;
  goto LAB_00117c80;
LAB_00117d58:
  for (uVar26 = 0; uVar26 < uVar38; uVar26 = uVar26 + 2) {
    if ((pbVar48[uVar26 + (long)local_1e0 + lVar49 + 2] == 0) &&
       (pbVar48[uVar26 + (long)local_1e0 + lVar49 + 3] == 0xff)) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x6c4,"received TLS_EMPTY_RENEGOTIATION_INFO ");
      if (ssl->renego_status != 1) {
        ssl->secure_renegotiation = 1;
        goto LAB_00117ebd;
      }
      pcVar44 = "received RENEGOTIATION SCSV during renegotiation";
      iVar17 = 0x6c8;
      goto LAB_001184d4;
    }
  }
  iVar17 = ssl->secure_renegotiation;
  if ((iVar17 == 1) || ((*(uint *)&ssl->conf->field_0x174 & 0x30) != 0x20)) {
    if (ssl->renego_status != 1) {
LAB_00117ebd:
      pmVar37 = ssl->conf;
LAB_00117ec0:
      piVar5 = pmVar37->ciphersuite_list[*piVar45];
      local_1f0 = (uchar *)0x0;
      bVar10 = false;
      do {
        if (piVar5[(long)local_1f0] == 0) {
          if (bVar10) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0x722,"got ciphersuites in common, but none of them usable");
            mbedtls_ssl_send_fatal_handshake_failure(ssl);
            return -0x6980;
          }
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0x728,"got no ciphersuites in common");
          mbedtls_ssl_send_fatal_handshake_failure(ssl);
          return -0x7380;
        }
        pbVar48 = local_178;
        for (uVar26 = 0; uVar26 < uVar38; uVar26 = uVar26 + 2) {
          iVar17 = piVar5[(long)local_1f0];
          if ((*pbVar48 == (byte)((uint)iVar17 >> 8)) && (pbVar48[1] == (byte)iVar17)) {
            pmVar28 = mbedtls_ssl_ciphersuite_from_id(iVar17);
            if (pmVar28 == (mbedtls_ssl_ciphersuite_t *)0x0) {
              pcVar44 = "should never happen";
              iVar17 = 0x2cc;
              goto LAB_001157f3;
            }
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0x2d0,"trying ciphersuite: %s",pmVar28->name);
            if ((ssl->minor_ver < pmVar28->min_minor_ver) ||
               (pmVar28->max_minor_ver < ssl->minor_ver)) {
              iVar17 = 0x2d5;
              pcVar44 = "ciphersuite mismatch: version";
            }
            else {
              uVar18 = *(uint *)&ssl->conf->field_0x174;
              if (((uVar18 & 2) != 0) && (bVar10 = true, (pmVar28->flags & 4) != 0))
              goto LAB_00117f80;
              if (((uVar18 & 0x40) == 0) || (pmVar28->cipher != MBEDTLS_CIPHER_ARC4_128)) {
                iVar17 = mbedtls_ssl_ciphersuite_uses_ec(pmVar28);
                if ((iVar17 == 0) ||
                   ((ppmVar34 = ssl->handshake->curves, ppmVar34 != (mbedtls_ecp_curve_info **)0x0
                    && (*ppmVar34 != (mbedtls_ecp_curve_info *)0x0)))) {
                  iVar17 = mbedtls_ssl_ciphersuite_uses_psk(pmVar28);
                  if (((iVar17 == 0) ||
                      (pmVar37 = ssl->conf,
                      pmVar37->f_psk !=
                      (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0)) ||
                     ((((pmVar37->psk != (uchar *)0x0 && (pmVar37->psk_identity != (uchar *)0x0)) &&
                       (pmVar37->psk_identity_len != 0)) && (pmVar37->psk_len != 0)))) {
                    mVar21 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(pmVar28);
                    pmVar43 = ssl->handshake->sni_key_cert;
                    if (pmVar43 == (mbedtls_ssl_key_cert *)0x0) {
                      pmVar43 = ssl->conf->key_cert;
                    }
                    if (mVar21 == MBEDTLS_PK_NONE) {
LAB_00118400:
                      iVar17 = 0;
                      mbedtls_debug_print_msg
                                (ssl,2,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                                 ,0x72e,"selected ciphersuite: %s",pmVar28->name);
                      ssl->session_negotiate->ciphersuite = piVar5[(long)local_1f0];
                      ssl->transform_negotiate->ciphersuite_info = pmVar28;
                      ssl->state = ssl->state + 1;
                      if ((ssl->conf->field_0x174 & 2) != 0) {
                        mbedtls_ssl_recv_flight_completed(ssl);
                      }
                      pcVar44 = "<= parse client hello";
                      iVar16 = 2;
                      line = 0x73a;
                      goto LAB_00115417;
                    }
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                               ,0x26f,"ciphersuite requires certificate");
                    if (pmVar43 == (mbedtls_ssl_key_cert *)0x0) {
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                                 ,0x273,"server has no certificate");
                    }
                    else {
                      local_1e0 = (mbedtls_ssl_key_cert *)0x0;
                      for (; pmVar11 = local_1e0, pmVar43 != (mbedtls_ssl_key_cert *)0x0;
                          pmVar43 = pmVar43->next) {
                        mbedtls_debug_print_crt
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                                   ,0x27a,"candidate certificate chain, certificate",pmVar43->cert);
                        iVar17 = mbedtls_pk_can_do(pmVar43->key,mVar21);
                        if (iVar17 == 0) {
                          iVar17 = 0x27e;
                          pcVar44 = "certificate mismatch: key type";
                        }
                        else {
                          iVar17 = mbedtls_ssl_check_cert_usage
                                             (pmVar43->cert,pmVar28,1,mbedtls_sha1.total);
                          if (iVar17 == 0) {
                            if (mVar21 == MBEDTLS_PK_ECDSA) {
                              ppmVar34 = ssl->handshake->curves;
                              do {
                                pmVar35 = *ppmVar34;
                                if (pmVar35 == (mbedtls_ecp_curve_info *)0x0) {
                                  iVar17 = 0x296;
                                  pcVar44 = "certificate mismatch: elliptic curve";
                                  goto LAB_00118199;
                                }
                                ppmVar34 = ppmVar34 + 1;
                              } while (pmVar35->grp_id != *pmVar43->key->pk_ctx);
                            }
                            pmVar11 = pmVar43;
                            if (2 < *piVar45) break;
                            pmVar39 = pmVar43->cert;
                            if (pmVar39->sig_md == MBEDTLS_MD_SHA1) goto LAB_001183d2;
                            if (local_1e0 == (mbedtls_ssl_key_cert *)0x0) {
                              local_1e0 = pmVar43;
                            }
                            iVar17 = 0x2a7;
                            pcVar44 = "certificate not preferred: sha-2 with pre-TLS 1.2 client";
                          }
                          else {
                            iVar17 = 0x28e;
                            pcVar44 = "certificate mismatch: (extended) key usage extension";
                          }
                        }
LAB_00118199:
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                                   ,iVar17,pcVar44);
                      }
                      local_1e0 = pmVar11;
                      if (local_1e0 != (mbedtls_ssl_key_cert *)0x0) {
                        pmVar39 = local_1e0->cert;
                        pmVar43 = local_1e0;
LAB_001183d2:
                        local_1e0 = pmVar43;
                        ssl->handshake->key_cert = local_1e0;
                        mbedtls_debug_print_crt
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                                   ,0x2b8,"selected certificate chain, certificate",pmVar39);
                        goto LAB_00118400;
                      }
                    }
                    iVar17 = 0x316;
                    pcVar44 = "ciphersuite mismatch: no suitable certificate";
                  }
                  else {
                    iVar17 = 0x306;
                    pcVar44 = "ciphersuite mismatch: no pre-shared key";
                  }
                }
                else {
                  iVar17 = 0x2f9;
                  pcVar44 = "ciphersuite mismatch: no common elliptic curve";
                }
              }
              else {
                iVar17 = 0x2e3;
                pcVar44 = "ciphersuite mismatch: rc4";
              }
            }
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,iVar17,pcVar44);
            bVar10 = true;
          }
LAB_00117f80:
          pbVar48 = pbVar48 + 2;
        }
        local_1f0 = (uchar *)((long)local_1f0 + 1);
      } while( true );
    }
    if (iVar17 == 1 && !bVar10) {
      pcVar44 = "renegotiation_info extension missing (secure)";
      iVar17 = 0x6e3;
    }
    else {
      pmVar37 = ssl->conf;
      if (iVar17 != 0) goto LAB_00117ec0;
      if ((pmVar37->field_0x174 & 0x30) == 0) {
        pcVar44 = "legacy renegotiation not allowed";
        iVar17 = 0x6ea;
      }
      else {
        if (!bVar10) goto LAB_00117ec0;
        pcVar44 = "renegotiation_info extension present (legacy)";
        iVar17 = 0x6f1;
      }
    }
  }
  else {
    pcVar44 = "legacy renegotiation, breaking off handshake";
    iVar17 = 0x6db;
  }
LAB_001184d4:
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,iVar17,pcVar44);
  iVar17 = mbedtls_ssl_send_fatal_handshake_failure(ssl);
  if (iVar17 == 0) {
    return -0x7900;
  }
  return iVar17;
}

Assistant:

int mbedtls_ssl_handshake_server_step( mbedtls_ssl_context *ssl )
{
    int ret = 0;

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER || ssl->handshake == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "server state: %d", ssl->state ) );

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
            return( ret );
    }
#endif

    switch( ssl->state )
    {
        case MBEDTLS_SSL_HELLO_REQUEST:
            ssl->state = MBEDTLS_SSL_CLIENT_HELLO;
            break;

        /*
         *  <==   ClientHello
         */
        case MBEDTLS_SSL_CLIENT_HELLO:
            ret = ssl_parse_client_hello( ssl );
            break;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
        case MBEDTLS_SSL_SERVER_HELLO_VERIFY_REQUEST_SENT:
            return( MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED );
#endif

        /*
         *  ==>   ServerHello
         *        Certificate
         *      ( ServerKeyExchange  )
         *      ( CertificateRequest )
         *        ServerHelloDone
         */
        case MBEDTLS_SSL_SERVER_HELLO:
            ret = ssl_write_server_hello( ssl );
            break;

        case MBEDTLS_SSL_SERVER_CERTIFICATE:
            ret = mbedtls_ssl_write_certificate( ssl );
            break;

        case MBEDTLS_SSL_SERVER_KEY_EXCHANGE:
            ret = ssl_write_server_key_exchange( ssl );
            break;

        case MBEDTLS_SSL_CERTIFICATE_REQUEST:
            ret = ssl_write_certificate_request( ssl );
            break;

        case MBEDTLS_SSL_SERVER_HELLO_DONE:
            ret = ssl_write_server_hello_done( ssl );
            break;

        /*
         *  <== ( Certificate/Alert  )
         *        ClientKeyExchange
         *      ( CertificateVerify  )
         *        ChangeCipherSpec
         *        Finished
         */
        case MBEDTLS_SSL_CLIENT_CERTIFICATE:
            ret = mbedtls_ssl_parse_certificate( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_KEY_EXCHANGE:
            ret = ssl_parse_client_key_exchange( ssl );
            break;

        case MBEDTLS_SSL_CERTIFICATE_VERIFY:
            ret = ssl_parse_certificate_verify( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC:
            ret = mbedtls_ssl_parse_change_cipher_spec( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_FINISHED:
            ret = mbedtls_ssl_parse_finished( ssl );
            break;

        /*
         *  ==> ( NewSessionTicket )
         *        ChangeCipherSpec
         *        Finished
         */
        case MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC:
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
            if( ssl->handshake->new_session_ticket != 0 )
                ret = ssl_write_new_session_ticket( ssl );
            else
#endif
                ret = mbedtls_ssl_write_change_cipher_spec( ssl );
            break;

        case MBEDTLS_SSL_SERVER_FINISHED:
            ret = mbedtls_ssl_write_finished( ssl );
            break;

        case MBEDTLS_SSL_FLUSH_BUFFERS:
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "handshake: done" ) );
            ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
            break;

        case MBEDTLS_SSL_HANDSHAKE_WRAPUP:
            mbedtls_ssl_handshake_wrapup( ssl );
            break;

        default:
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "invalid state %d", ssl->state ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    return( ret );
}